

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation.cpp
# Opt level: O1

shared_ptr<duckdb::Relation,_true> __thiscall
duckdb::Relation::Aggregate
          (Relation *this,
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
          *expressions,string *group_list)

{
  ParserOptions options_00;
  element_type *peVar1;
  ClientContext *pCVar2;
  DatabaseInstance *pDVar3;
  string *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::Relation,_true> sVar4;
  ParserOptions options;
  GroupByNode groups;
  undefined1 local_a1;
  undefined1 local_a0;
  undefined1 uStack_9f;
  undefined6 uStack_9e;
  idx_t iStack_98;
  vector<duckdb::ParserExtension,_true> *local_90;
  undefined1 local_88 [24];
  element_type *peStack_70;
  enable_shared_from_this<duckdb::Relation> local_68;
  GroupByNode local_58;
  
  shared_ptr<duckdb::ClientContextWrapper,_true>::operator->
            ((shared_ptr<duckdb::ClientContextWrapper,_true> *)(expressions + 1));
  ClientContextWrapper::GetContext((ClientContextWrapper *)local_88);
  pCVar2 = shared_ptr<duckdb::ClientContext,_true>::operator->
                     ((shared_ptr<duckdb::ClientContext,_true> *)local_88);
  local_90 = (vector<duckdb::ParserExtension,_true> *)0x0;
  local_a0 = (pCVar2->config).preserve_identifier_case;
  uStack_9f = (pCVar2->config).integer_division;
  iStack_98 = (pCVar2->config).max_expression_depth;
  pDVar3 = shared_ptr<duckdb::DatabaseInstance,_true>::operator->(&pCVar2->db);
  local_90 = &(pDVar3->config).parser_extensions;
  options_00.integer_division = (bool)uStack_9f;
  options_00.preserve_identifier_case = (bool)local_a0;
  options_00._2_6_ = uStack_9e;
  options_00.max_expression_depth = iStack_98;
  options_00.extensions = local_90;
  Parser::ParseGroupByList(&local_58,in_RCX,options_00);
  if ((element_type *)local_88._8_8_ != (element_type *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
  }
  enable_shared_from_this<duckdb::Relation>::shared_from_this(&local_68);
  local_88._0_8_ = (AggregateRelation *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::AggregateRelation,std::allocator<duckdb::AggregateRelation>,duckdb::shared_ptr<duckdb::Relation,true>,duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>,duckdb::GroupByNode>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8),
             (AggregateRelation **)local_88,(allocator<duckdb::AggregateRelation> *)&local_a1,
             (shared_ptr<duckdb::Relation,_true> *)&local_68,
             (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              *)group_list,&local_58);
  shared_ptr<duckdb::AggregateRelation,_true>::shared_ptr
            ((shared_ptr<duckdb::AggregateRelation,_true> *)(local_88 + 0x10),
             (shared_ptr<duckdb::AggregateRelation> *)local_88);
  if ((element_type *)local_88._8_8_ != (element_type *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
  }
  peVar1 = peStack_70;
  (this->super_enable_shared_from_this<duckdb::Relation>).__weak_this_.internal.
  super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  peStack_70 = (element_type *)0x0;
  this->_vptr_Relation = (_func_int **)local_88._16_8_;
  (this->super_enable_shared_from_this<duckdb::Relation>).__weak_this_.internal.
  super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  local_88._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (local_68.__weak_this_.internal.super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.__weak_this_.internal.
               super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  ::std::
  vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&local_58.grouping_sets.
             super_vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
           );
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             *)&local_58);
  sVar4.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  sVar4.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<duckdb::Relation,_true>)
         sVar4.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<Relation> Relation::Aggregate(vector<unique_ptr<ParsedExpression>> expressions, const string &group_list) {
	auto groups = Parser::ParseGroupByList(group_list, context->GetContext()->GetParserOptions());
	return make_shared_ptr<AggregateRelation>(shared_from_this(), std::move(expressions), std::move(groups));
}